

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::NetParameter::MergePartialFromCodedStream(NetParameter *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  void *pvVar5;
  uint8 *puVar6;
  Rep *pRVar7;
  Arena *this_01;
  char *data;
  uint uVar8;
  bool bVar9;
  short extraout_AX;
  uint32 uVar10;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  NetState *this_05;
  ulong extraout_RAX;
  pair<int,_int> pVar11;
  string *value;
  Type *pTVar12;
  UnknownFieldSet *unknown_fields;
  int iVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  pair<unsigned_long,_bool> pVar18;
  pair<unsigned_long,_bool> pVar19;
  int local_7c;
  
  this_00 = &this->input_;
  do {
    pbVar4 = input->buffer_;
    uVar10 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar10 = (uint32)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar15 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar15) < 0x80)) goto LAB_00404aef;
        uVar15 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar16 = (ulong)uVar15 | 0x100000000;
    }
    else {
LAB_00404aef:
      uVar10 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar10);
      uVar16 = 0;
      if (uVar10 - 1 < 0x3fff) {
        uVar16 = 0x100000000;
      }
      uVar16 = uVar10 | uVar16;
    }
    uVar15 = (uint)uVar16;
    if ((uVar16 & 0x100000000) == 0) {
LAB_00404622:
      iVar17 = 7;
      if ((uVar15 & 7) == 4 || uVar15 == 0) goto LAB_00404664;
      pvVar5 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar5 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
      }
      bVar9 = google::protobuf::internal::WireFormat::SkipField(input,uVar15,unknown_fields);
LAB_00404659:
      if (bVar9 != false) goto LAB_00404661;
LAB_00404b14:
      iVar17 = 6;
      goto LAB_00404664;
    }
    uVar8 = (uint)(uVar16 >> 3) & 0x1fffffff;
    cVar14 = (char)uVar16;
    switch(uVar8) {
    case 1:
      MergePartialFromCodedStream();
      if (extraout_AX == 0) goto LAB_00404622;
      iVar17 = 6;
      if (extraout_AX == 1) break;
      goto LAB_00404661;
    case 2:
      if (cVar14 != '\x12') goto LAB_00404622;
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar13 = (int)(char)*puVar6, -1 < (char)*puVar6)) {
        input->buffer_ = puVar6 + 1;
        bVar9 = true;
      }
      else {
        iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar9 = -1 < iVar13;
      }
      iVar17 = 6;
      if (bVar9) {
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar13);
        if (-1 < (long)pVar11) {
          bVar9 = V1LayerParameter::MergePartialFromCodedStream(this_02,input);
LAB_0040499a:
          iVar17 = 6;
          if (bVar9 != false) {
            bVar9 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar11.first);
            if (bVar9) goto LAB_00404661;
            break;
          }
        }
LAB_004049ba:
        iVar17 = 6;
      }
      break;
    case 3:
      if (cVar14 != '\x1a') goto LAB_00404622;
      pRVar7 = (this->input_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
LAB_004049c9:
        google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,
                   (this->input_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_004049d9:
        pRVar7 = (this->input_).super_RepeatedPtrFieldBase.rep_;
        pRVar7->allocated_size = pRVar7->allocated_size + 1;
        this_01 = (this->input_).super_RepeatedPtrFieldBase.arena_;
        if (this_01 == (Arena *)0x0) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
        }
        else {
          value = (string *)
                  google::protobuf::Arena::AllocateAligned
                            (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          google::protobuf::Arena::AddListNode
                    (this_01,value,
                     google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
        }
        pRVar7 = (this->input_).super_RepeatedPtrFieldBase.rep_;
        iVar13 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
        (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
        pRVar7->elements[iVar13] = value;
      }
      else {
        iVar13 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar7->allocated_size <= iVar13) {
          if (pRVar7->allocated_size == (this->input_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_004049c9;
          goto LAB_004049d9;
        }
        (this->input_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
        value = (string *)pRVar7->elements[iVar13];
      }
      bVar9 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar9) goto LAB_00404b14;
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar12->_M_dataplus)._M_p;
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->input_).super_RepeatedPtrFieldBase.current_size_ + -1);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar12->_M_string_length,PARSE,"caffe.NetParameter.input");
LAB_00404661:
      iVar17 = 0;
      break;
    case 4:
      if (cVar14 == '\"') {
        bVar9 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->input_dim_);
      }
      else {
        if ((uVar15 & 0xff) != 0x20) goto LAB_00404622;
        bVar9 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x20,input,&this->input_dim_);
      }
      goto LAB_00404659;
    case 5:
      if (cVar14 != '(') goto LAB_00404622;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
        input->buffer_ = puVar6 + 1;
        pVar18._8_8_ = 1;
        pVar18.first = (long)(char)uVar3;
      }
      else {
        pVar18 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar17 = 6;
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->force_backward_ = pVar18.first != 0;
        goto LAB_00404661;
      }
      break;
    case 6:
      if (cVar14 != '2') goto LAB_00404622;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->state_ == (NetState *)0x0) {
        this_05 = (NetState *)operator_new(0x38);
        NetState::NetState(this_05);
        this->state_ = this_05;
      }
      MergePartialFromCodedStream();
      iVar17 = local_7c;
      if ((extraout_RAX & 1) == 0) goto LAB_00404661;
      break;
    case 7:
      if (cVar14 != '8') goto LAB_00404622;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar3 = *puVar6, -1 < (long)(char)uVar3)) {
        input->buffer_ = puVar6 + 1;
        pVar19._8_8_ = 1;
        pVar19.first = (long)(char)uVar3;
      }
      else {
        pVar19 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar17 = 6;
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->debug_info_ = pVar19.first != 0;
        goto LAB_00404661;
      }
      break;
    case 8:
      if (cVar14 != 'B') goto LAB_00404622;
      this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                          (&(this->input_shape_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar13 = (int)(char)*puVar6, -1 < (char)*puVar6)) {
        input->buffer_ = puVar6 + 1;
        bVar9 = true;
      }
      else {
        iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar9 = -1 < iVar13;
      }
      iVar17 = 6;
      if (bVar9) {
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar13);
        if (-1 < (long)pVar11) {
          bVar9 = BlobShape::MergePartialFromCodedStream(this_04,input);
          goto LAB_0040499a;
        }
        goto LAB_004049ba;
      }
      break;
    default:
      if ((uVar8 != 100) || (cVar14 != '\"')) goto LAB_00404622;
      this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (&(this->layer_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (iVar13 = (int)(char)*puVar6, -1 < (char)*puVar6)) {
        input->buffer_ = puVar6 + 1;
        bVar9 = true;
      }
      else {
        iVar13 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar9 = -1 < iVar13;
      }
      iVar17 = 6;
      if (bVar9) {
        pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar13);
        if (-1 < (long)pVar11) {
          bVar9 = LayerParameter::MergePartialFromCodedStream(this_03,input);
          goto LAB_0040499a;
        }
        goto LAB_004049ba;
      }
    }
LAB_00404664:
    if (iVar17 != 0) {
      return iVar17 != 6;
    }
  } while( true );
}

Assistant:

bool NetParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.V1LayerParameter layers = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string input = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_input()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->input(this->input_size() - 1).data(),
            this->input(this->input_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetParameter.input");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 input_dim = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 32u, input, this->mutable_input_dim())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_input_dim())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_backward = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_force_backward();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_backward_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.NetState state = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_state()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool debug_info = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_debug_info();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &debug_info_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobShape input_shape = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_input_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.LayerParameter layer = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_layer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetParameter)
  return false;
#undef DO_
}